

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.hpp
# Opt level: O3

string * __thiscall
History::get_last_cmd(string *__return_storage_ptr__,History *this,string *sess_id,string *pwd)

{
  Database *this_00;
  bool bVar1;
  sqlite3_stmt *stmt;
  uchar *puVar2;
  Query query;
  allocator local_91;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  string *local_88;
  Query local_80;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  this_00 = &this->db;
  local_88 = pwd;
  local_80.db = this_00;
  stmt = sqlite::Database::prepare_sql(this_00,&(this->lcSch).select);
  local_80.stmt._M_t.super___uniq_ptr_impl<sqlite3_stmt,_std::function<void_(sqlite3_stmt_*)>_>._M_t
  .super__Tuple_impl<0UL,_sqlite3_stmt_*,_std::function<void_(sqlite3_stmt_*)>_>.
  super__Tuple_impl<1UL,_std::function<void_(sqlite3_stmt_*)>_>.
  super__Head_base<1UL,_std::function<void_(sqlite3_stmt_*)>,_false>._M_head_impl._M_invoker =
       std::
       _Function_handler<void_(sqlite3_stmt_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dkolmakov[P]hm/src/././query.hpp:36:44)>
       ::_M_invoke;
  local_80.stmt._M_t.super___uniq_ptr_impl<sqlite3_stmt,_std::function<void_(sqlite3_stmt_*)>_>._M_t
  .super__Tuple_impl<0UL,_sqlite3_stmt_*,_std::function<void_(sqlite3_stmt_*)>_>.
  super__Tuple_impl<1UL,_std::function<void_(sqlite3_stmt_*)>_>.
  super__Head_base<1UL,_std::function<void_(sqlite3_stmt_*)>,_false>._M_head_impl.
  super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_80.stmt._M_t.super___uniq_ptr_impl<sqlite3_stmt,_std::function<void_(sqlite3_stmt_*)>_>._M_t
  .super__Tuple_impl<0UL,_sqlite3_stmt_*,_std::function<void_(sqlite3_stmt_*)>_>.
  super__Tuple_impl<1UL,_std::function<void_(sqlite3_stmt_*)>_>.
  super__Head_base<1UL,_std::function<void_(sqlite3_stmt_*)>,_false>._M_head_impl.
  super__Function_base._M_functor._8_8_ = 0;
  local_80.stmt._M_t.super___uniq_ptr_impl<sqlite3_stmt,_std::function<void_(sqlite3_stmt_*)>_>._M_t
  .super__Tuple_impl<0UL,_sqlite3_stmt_*,_std::function<void_(sqlite3_stmt_*)>_>.
  super__Tuple_impl<1UL,_std::function<void_(sqlite3_stmt_*)>_>.
  super__Head_base<1UL,_std::function<void_(sqlite3_stmt_*)>,_false>._M_head_impl.
  super__Function_base._M_manager =
       std::
       _Function_handler<void_(sqlite3_stmt_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dkolmakov[P]hm/src/././query.hpp:36:44)>
       ::_M_manager;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_80.stmt._M_t.super___uniq_ptr_impl<sqlite3_stmt,_std::function<void_(sqlite3_stmt_*)>_>._M_t
  .super__Tuple_impl<0UL,_sqlite3_stmt_*,_std::function<void_(sqlite3_stmt_*)>_>.
  super__Head_base<0UL,_sqlite3_stmt_*,_false>._M_head_impl = stmt;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  local_90 = &__return_storage_ptr__->field_2;
  sqlite::Database::bind_value
            (this_00,stmt,
             &(this->lcSch).super_LastCommandsSchemaColumnsList.sess_id.super_ColumnBase.bName,
             sess_id);
  sqlite::Database::bind_value
            (local_80.db,
             local_80.stmt._M_t.
             super___uniq_ptr_impl<sqlite3_stmt,_std::function<void_(sqlite3_stmt_*)>_>._M_t.
             super__Tuple_impl<0UL,_sqlite3_stmt_*,_std::function<void_(sqlite3_stmt_*)>_>.
             super__Head_base<0UL,_sqlite3_stmt_*,_false>._M_head_impl,
             &(this->lcSch).super_LastCommandsSchemaColumnsList.pwd.super_ColumnBase.bName,local_88)
  ;
  while( true ) {
    bVar1 = sqlite::Query::exec_step(&local_80);
    if (!bVar1) break;
    puVar2 = sqlite3_column_text(local_80.stmt._M_t.
                                 super___uniq_ptr_impl<sqlite3_stmt,_std::function<void_(sqlite3_stmt_*)>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_sqlite3_stmt_*,_std::function<void_(sqlite3_stmt_*)>_>
                                 .super__Head_base<0UL,_sqlite3_stmt_*,_false>._M_head_impl,
                                 (this->lcSch).super_LastCommandsSchemaColumnsList.cmd.
                                 super_ColumnBase.pos);
    std::__cxx11::string::string((string *)local_50,(char *)puVar2,&local_91);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  std::unique_ptr<sqlite3_stmt,_std::function<void_(sqlite3_stmt_*)>_>::~unique_ptr(&local_80.stmt);
  return __return_storage_ptr__;
}

Assistant:

std::string get_last_cmd(const std::string& sess_id, const std::string& pwd) {
    sqlite::Query query(db, lcSch.select);
    std::string cmd = "";

    query.bind(lcSch.sess_id.bName,
               sess_id);  // TODO(dkolmakov): Implement type safe binding
    query.bind(lcSch.pwd.bName, pwd);

    while (query.exec_step()) {
      cmd = query.get_string(lcSch.cmd.getPos());
    }

    return cmd;
  }